

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CRTPBase.cpp
# Opt level: O2

void CATCH2_INTERNAL_TEMPLATE_TEST_0<CRTPTest&>(void)

{
  StringRef macroName;
  StringRef capturedExpression;
  CRTPTest instance;
  CRTPTest *local_98;
  CRTPTest *local_90;
  ITransientExpression local_88;
  CRTPTest **local_78;
  char *local_70;
  undefined8 local_68;
  CRTPTest **local_60;
  AssertionHandler catchAssertionHandler;
  
  local_88._vptr_ITransientExpression = (_func_int **)0x30224f;
  local_88.m_isBinaryExpression = true;
  local_88.m_result = false;
  local_88._10_6_ = 0;
  macroName.m_size = 7;
  macroName.m_start = "REQUIRE";
  capturedExpression.m_size = 0x11;
  capturedExpression.m_start = "&instance == &ref";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName,(SourceLineInfo *)&local_88,capturedExpression,Normal)
  ;
  local_98 = &instance;
  local_78 = &local_90;
  local_60 = &local_98;
  local_88._8_2_ = 0x101;
  local_88._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_003cbd20;
  local_70 = "==";
  local_68 = 2;
  local_90 = local_98;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_88);
  Catch::ITransientExpression::~ITransientExpression(&local_88);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  return;
}

Assistant:

constexpr decltype(auto) access() &
	{
		return derived();
	}